

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::helper::
     heapsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator Td,iterator SA,value_type size)

{
  iterator __b;
  iterator __a;
  iterator __a_00;
  iterator SA_00;
  iterator SA_01;
  iterator SA_02;
  iterator Td_00;
  iterator Td_01;
  iterator Td_02;
  bool bVar1;
  value_reference *val;
  iterator *in_RDX;
  long in_R8;
  reference rVar2;
  iterator iVar3;
  pos_type t;
  pos_type m;
  pos_type i;
  value_reference *in_stack_fffffffffffffe98;
  reference in_stack_fffffffffffffea0;
  pos_type i_00;
  iterator *in_stack_fffffffffffffeb0;
  BitmapArray<long> *in_stack_fffffffffffffeb8;
  pos_type in_stack_fffffffffffffec0;
  BitmapArray<long> *in_stack_fffffffffffffec8;
  pos_type in_stack_fffffffffffffed0;
  iterator in_stack_ffffffffffffff60;
  BitmapArray<long> *in_stack_ffffffffffffff70;
  BitmapArray<long> *in_stack_ffffffffffffff78;
  BitmapArray<long> *in_stack_ffffffffffffff80;
  BitmapArray<long> *in_stack_ffffffffffffff88;
  BitmapArray<long> *in_stack_ffffffffffffff90;
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = in_R8;
  if (in_R8 % 2 == 0) {
    local_38 = in_R8 + -1;
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0.pos_);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12729e);
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0.pos_);
    rVar2 = bitmap::BitmapArray<long>::iterator::operator[]
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0.pos_);
    in_stack_ffffffffffffff80 = rVar2.array_;
    in_stack_ffffffffffffff88 = (BitmapArray<long> *)rVar2.pos_;
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1272f0);
    rVar2 = bitmap::BitmapArray<long>::iterator::operator[]
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0.pos_);
    in_stack_ffffffffffffff90 = rVar2.array_;
    bVar1 = bitmap::BitmapArray<long>::value_reference::operator<
                      ((value_reference *)in_stack_fffffffffffffea0.array_,in_stack_fffffffffffffe98
                      );
    if (bVar1) {
      iVar3 = bitmap::BitmapArray<long>::iterator::operator+
                        ((iterator *)in_stack_fffffffffffffea0.pos_,
                         (difference_type)in_stack_fffffffffffffea0.array_);
      in_stack_ffffffffffffff70 = iVar3.array_;
      in_stack_ffffffffffffff78 = (BitmapArray<long> *)iVar3.pos_;
      in_stack_ffffffffffffff60 =
           bitmap::BitmapArray<long>::iterator::operator+
                     ((iterator *)in_stack_fffffffffffffea0.pos_,
                      (difference_type)in_stack_fffffffffffffea0.array_);
      __a.pos_ = in_stack_fffffffffffffed0;
      __a.array_ = in_stack_fffffffffffffec8;
      iVar3.pos_ = in_stack_fffffffffffffec0;
      iVar3.array_ = in_stack_fffffffffffffeb8;
      std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (__a,iVar3);
    }
  }
  local_30 = local_38 / 2;
  while (local_30 = local_30 + -1, -1 < local_30) {
    Td_00.pos_ = (pos_type)in_stack_ffffffffffffff90;
    Td_00.array_ = in_stack_ffffffffffffff88;
    SA_00.pos_ = (pos_type)in_stack_ffffffffffffff80;
    SA_00.array_ = in_stack_ffffffffffffff78;
    fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
              (Td_00,SA_00,(long)in_stack_ffffffffffffff70,in_stack_ffffffffffffff60.pos_);
  }
  local_30 = local_38;
  if (in_R8 % 2 == 0) {
    bitmap::BitmapArray<long>::iterator::operator+
              ((iterator *)in_stack_fffffffffffffea0.pos_,
               (difference_type)in_stack_fffffffffffffea0.array_);
    __a_00.pos_ = in_stack_fffffffffffffed0;
    __a_00.array_ = in_stack_fffffffffffffec8;
    __b.pos_ = in_stack_fffffffffffffec0;
    __b.array_ = in_stack_fffffffffffffeb8;
    std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (__a_00,__b);
    Td_01.pos_ = (pos_type)in_stack_ffffffffffffff90;
    Td_01.array_ = in_stack_ffffffffffffff88;
    SA_01.pos_ = (pos_type)in_stack_ffffffffffffff80;
    SA_01.array_ = in_stack_ffffffffffffff78;
    fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
              (Td_01,SA_01,(long)in_stack_ffffffffffffff70,in_stack_ffffffffffffff60.pos_);
  }
  while (local_30 = local_30 + -1, 0 < local_30) {
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0.pos_);
    val = (value_reference *)
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x127594);
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0.pos_);
    bitmap::BitmapArray<long>::iterator::operator[]
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0.pos_);
    i_00 = in_stack_fffffffffffffea0.pos_;
    bitmap::BitmapArray<long>::value_reference::operator=
              ((value_reference *)in_stack_fffffffffffffea0.array_,in_stack_fffffffffffffe98);
    Td_02.pos_ = (pos_type)in_stack_ffffffffffffff90;
    Td_02.array_ = in_stack_ffffffffffffff88;
    SA_02.pos_ = (pos_type)in_stack_ffffffffffffff80;
    SA_02.array_ = in_stack_ffffffffffffff78;
    in_stack_fffffffffffffeb0 = in_RDX;
    fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
              (Td_02,SA_02,(long)in_stack_ffffffffffffff70,in_stack_ffffffffffffff60.pos_);
    in_stack_fffffffffffffea0 =
         bitmap::BitmapArray<long>::iterator::operator[](in_stack_fffffffffffffeb0,i_00);
    bitmap::BitmapArray<long>::value_reference::operator=
              ((value_reference *)in_stack_fffffffffffffea0.array_,(long)val);
    in_stack_fffffffffffffe98 = val;
  }
  return;
}

Assistant:

void heapsort(const StringIterator_type Td, SAIterator_type SA,
              typename std::iterator_traits<SAIterator_type>::value_type size) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  pos_type i, m;
  pos_type t;

  m = size;
  if ((size % 2) == 0) {
    m--;
    if (Td[SA[m / 2]] < Td[SA[m]]) {
      std::iter_swap(SA + m, SA + m / 2);
    }
  }

  for (i = m / 2 - 1; 0 <= i; --i) {
    fixdown(Td, SA, i, m);
  }

  if ((size % 2) == 0) {
    std::iter_swap(SA, SA + m);
    fixdown(Td, SA, pos_type(0), m);
  }

  for (i = m - 1; 0 < i; --i) {
    t = SA[0];
    SA[0] = SA[i];
    fixdown(Td, SA, pos_type(0), i);
    SA[i] = t;
  }
}